

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.cc
# Opt level: O2

void __thiscall Varnode::saveXml(Varnode *this,ostream *s)

{
  AddrSpace *pAVar1;
  uint uVar2;
  allocator local_31;
  string local_30;
  
  std::operator<<(s,"<addr");
  pAVar1 = (this->loc).base;
  (*pAVar1->_vptr_AddrSpace[8])(pAVar1,s,(this->loc).offset,(ulong)(uint)this->size);
  std::__cxx11::string::string((string *)&local_30,"ref",&local_31);
  a_v_u(s,&local_30,(ulong)this->create_index);
  std::__cxx11::string::~string((string *)&local_30);
  if (this->mergegroup != 0) {
    std::__cxx11::string::string((string *)&local_30,"grp",&local_31);
    a_v_i(s,&local_30,(long)this->mergegroup);
    std::__cxx11::string::~string((string *)&local_30);
  }
  uVar2 = this->flags;
  if ((short)uVar2 < 0) {
    std::operator<<(s," persists=\"true\"");
    uVar2 = this->flags;
  }
  if ((~uVar2 & 0x10020) == 0) {
    std::operator<<(s," addrtied=\"true\"");
    uVar2 = this->flags;
  }
  if ((uVar2 >> 0x11 & 1) != 0) {
    std::operator<<(s," unaff=\"true\"");
    uVar2 = this->flags;
  }
  if ((uVar2 & 8) != 0) {
    std::operator<<(s," input=\"true\"");
  }
  std::operator<<(s,"/>");
  return;
}

Assistant:

void Varnode::saveXml(ostream &s) const

{
  s << "<addr";
  loc.getSpace()->saveXmlAttributes(s,loc.getOffset(),size);
  a_v_u(s,"ref",getCreateIndex());
  if (mergegroup != 0)
    a_v_i(s,"grp",getMergeGroup());
  if (isPersist())
    s << " persists=\"true\"";
  if (isAddrTied())
    s << " addrtied=\"true\"";
  if (isUnaffected())
    s << " unaff=\"true\"";
  if (isInput())
    s << " input=\"true\"";
  s << "/>";
}